

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderApiTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::ProgramBinaryCase::ProgramBinaryCase
          (ProgramBinaryCase *this,Context *context,char *name,char *desc)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  TestContext *this_00;
  TestLog *log;
  char *desc_local;
  char *name_local;
  Context *context_local;
  ProgramBinaryCase *this_local;
  
  gles3::TestCase::TestCase(&this->super_TestCase,context,name,desc);
  pRVar2 = gles3::Context::getRenderContext(context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  this_00 = gles3::Context::getTestContext(context);
  log = tcu::TestContext::getLog(this_00);
  glu::CallLogWrapper::CallLogWrapper
            (&this->super_CallLogWrapper,(Functions *)CONCAT44(extraout_var,iVar1),log);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ProgramBinaryCase_032888b0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->m_formats);
  return;
}

Assistant:

ProgramBinaryCase::ProgramBinaryCase (Context& context, const char* name, const char* desc)
		: TestCase			(context, name, desc)
		, CallLogWrapper	(context.getRenderContext().getFunctions(), context.getTestContext().getLog())
{
}